

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.h
# Opt level: O0

void __thiscall
TPZSkylMatrix<std::complex<long_double>_>::~TPZSkylMatrix
          (TPZSkylMatrix<std::complex<long_double>_> *this)

{
  void *in_RDI;
  
  ~TPZSkylMatrix((TPZSkylMatrix<std::complex<long_double>_> *)0x1387c68);
  operator_delete(in_RDI,0x60);
  return;
}

Assistant:

virtual ~TPZSkylMatrix() { Clear(); }